

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O2

void OpenMD::registerIntegrators(void)

{
  IntegratorFactory *pIVar1;
  IntegratorCreator *pIVar2;
  allocator<char> local_39;
  string local_38;
  
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NVE",&local_39);
  IntegratorBuilder<OpenMD::NVE>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NVE> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NVT",&local_39);
  IntegratorBuilder<OpenMD::NVT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NVT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPTI",&local_39);
  IntegratorBuilder<OpenMD::NPTi>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTi> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPTF",&local_39);
  IntegratorBuilder<OpenMD::NPTf>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTf> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPTXYZ",&local_39);
  IntegratorBuilder<OpenMD::NPTxyz>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTxyz> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPAT",&local_39);
  IntegratorBuilder<OpenMD::NPAT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPAT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPA",&local_39);
  IntegratorBuilder<OpenMD::NPA>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPA> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPRT",&local_39);
  IntegratorBuilder<OpenMD::NPrT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPrT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NPGT",&local_39);
  IntegratorBuilder<OpenMD::NPrT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPrT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NGT",&local_39);
  IntegratorBuilder<OpenMD::NgammaT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NgammaT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NGAMMAT",&local_39);
  IntegratorBuilder<OpenMD::NgammaT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NgammaT> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"LANGEVINDYNAMICS",&local_39);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinDynamics> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LD",&local_39);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinDynamics> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LHULL",&local_39);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinDynamics> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LANGEVINHULL",&local_39);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinDynamics> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SMIPD",&local_39);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinDynamics> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LANGEVINPISTON",&local_39)
  ;
  IntegratorBuilder<OpenMD::LangevinPiston>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinPiston> *)pIVar2,&local_38);
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void registerIntegrators() {
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVE>("NVE"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVT>("NVT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTi>("NPTI"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTf>("NPTF"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTxyz>("NPTXYZ"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPAT>("NPAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPA>("NPA"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPRT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGAMMAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINDYNAMICS"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("SMIPD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinPiston>("LANGEVINPISTON"));
  }